

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O0

int __thiscall Move::input_move(Move *this)

{
  int r;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  istream *piVar5;
  long *plVar6;
  reference pcVar7;
  char *pcVar8;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string local_220 [8];
  string acr;
  string local_200 [8];
  string ss;
  int local_1dc;
  int local_1d8;
  int p;
  int j;
  int i;
  stringstream line;
  string local_38 [8];
  string sss;
  Move *this_local;
  
  std::__cxx11::string::string(local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_38);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&j,local_38,_Var3);
  std::__cxx11::string::string(local_200);
  std::__cxx11::string::string(local_220);
  piVar5 = std::operator>>((istream *)&j,local_200);
  bVar1 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this_local._4_4_ = 0;
    goto LAB_00119974;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_200,".");
  if (bVar2) {
    this_local._4_4_ = -1;
    goto LAB_00119974;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_200,"!");
  if (bVar2) {
    std::operator>>((istream *)&j,(string *)&this->swap_letters);
    this_local._4_4_ = 2;
    goto LAB_00119974;
  }
  plVar6 = (long *)std::istream::operator>>((istream *)&j,&p);
  bVar1 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if ((bVar1 & 1) == 0) {
    plVar6 = (long *)std::istream::operator>>((istream *)&j,&local_1d8);
    bVar1 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    if ((bVar1 & 1) != 0) goto LAB_00119792;
  }
  else {
LAB_00119792:
    local_1d8 = (this->bsize + 1) / 2;
    p = local_1d8;
  }
  piVar5 = std::operator>>((istream *)&j,local_220);
  bVar1 = std::ios::operator!((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::operator=(local_220,"a");
  }
  plVar6 = (long *)std::istream::operator>>((istream *)&j,&local_1dc);
  bVar1 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_1dc = -1;
  }
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), r = p, iVar4 = local_1d8, bVar2) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    iVar4 = toupper((int)*pcVar7);
    *pcVar7 = (char)iVar4;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_220);
  set_all(this,(string *)local_200,r,iVar4,*pcVar8 != 'd',0,local_1dc,0);
  this_local._4_4_ = 1;
LAB_00119974:
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&j);
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

int input_move() {
        std::string sss;
        getline(std::cin, sss);
        std::stringstream line{sss};
        int i, j, p;
        std::string ss, acr;
        if (!(line >> ss)) return 0;
        if (ss == ".") return -1;
        if (ss == "!") {
            line >> this->swap_letters;
            return 2;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        set_all(ss, i, j, acr[0] != 'd', 0, p);
        return 1;
    }